

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O2

void __thiscall libtorrent::upnp::open_unicast_socket(upnp *this,socket_package *s,error_code *ec)

{
  socklen_t in_ECX;
  element_type *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  undefined1 local_68 [24];
  element_type *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_48;
  data_union local_40;
  
  local_68._0_4_ = 2;
  boost::asio::
  basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::open((basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
          *)s,local_68,(int)ec);
  if (ec->failed_ == false) {
    local_68._0_8_ = (ulong)(this->m_listen_address).addr_.s_addr << 0x20;
    local_68._8_8_ = 0;
    local_68._16_8_ = 0;
    local_50 = (element_type *)0x0;
    boost::asio::ip::detail::endpoint::endpoint((endpoint *)&local_40.base,(address *)local_68,0);
    boost::asio::
    basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::bind((basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
            *)s,(int)&local_40,(sockaddr *)ec,in_ECX);
    if (ec->failed_ == false) {
      local_40._0_8_ = &s->buffer;
      local_40.base.sa_data[6] = 0xdc;
      local_40.base.sa_data[7] = '\x05';
      local_40.base.sa_data[8] = '\0';
      local_40.base.sa_data[9] = '\0';
      local_40.base.sa_data[10] = '\0';
      local_40.base.sa_data[0xb] = '\0';
      local_40.base.sa_data[0xc] = '\0';
      local_40.base.sa_data[0xd] = '\0';
      ::std::__shared_ptr<libtorrent::upnp,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<libtorrent::upnp,void>
                ((__shared_ptr<libtorrent::upnp,(__gnu_cxx::_Lock_policy)2> *)&local_78,
                 (__weak_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2> *)this);
      local_68._0_8_ = on_reply;
      local_68._8_8_ = 0;
      local_50 = local_78;
      _Stack_48._M_pi = _Stack_70._M_pi;
      local_78 = (element_type *)0x0;
      _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_68._16_8_ = s;
      boost::asio::
      basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
      ::
      async_receive_from<boost::asio::mutable_buffer,std::_Bind<void(libtorrent::upnp::*(std::shared_ptr<libtorrent::upnp>,std::reference_wrapper<libtorrent::aux::socket_package>,std::_Placeholder<1>,std::_Placeholder<2>))(libtorrent::aux::socket_package&,boost::system::error_code_const&,unsigned_long)>>
                ((basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                  *)s,(mutable_buffer *)&local_40.base,&s->remote,
                 (_Bind<void_(libtorrent::upnp::*(std::shared_ptr<libtorrent::upnp>,_std::reference_wrapper<libtorrent::aux::socket_package>,_std::_Placeholder<1>,_std::_Placeholder<2>))(libtorrent::aux::socket_package_&,_const_boost::system::error_code_&,_unsigned_long)>
                  *)local_68);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_70);
    }
  }
  return;
}

Assistant:

void upnp::open_unicast_socket(aux::socket_package& s, error_code& ec)
{
	s.socket.open(udp::v4(), ec);
	if (ec) return;
	s.socket.bind(udp::endpoint(m_listen_address, 0), ec);
	if (ec) return;

	ADD_OUTSTANDING_ASYNC("upnp::on_reply");
	s.socket.async_receive_from(boost::asio::buffer(s.buffer), s.remote
		, std::bind(&upnp::on_reply, self(), std::ref(s), _1, _2));
}